

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

StringFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_stringtype(FeatureType *this)

{
  bool bVar1;
  StringFeatureType *this_00;
  FeatureType *this_local;
  
  bVar1 = has_stringtype(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_stringtype(this);
    this_00 = (StringFeatureType *)operator_new(0x18);
    StringFeatureType::StringFeatureType(this_00);
    (this->Type_).stringtype_ = this_00;
  }
  return (StringFeatureType *)(this->Type_).int64type_;
}

Assistant:

inline ::CoreML::Specification::StringFeatureType* FeatureType::mutable_stringtype() {
  if (!has_stringtype()) {
    clear_Type();
    set_has_stringtype();
    Type_.stringtype_ = new ::CoreML::Specification::StringFeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.stringType)
  return Type_.stringtype_;
}